

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O0

void __thiscall
argh::stringstream_proxy::stringstream_proxy(stringstream_proxy *this,stringstream_proxy *other)

{
  undefined8 uVar1;
  string local_38 [32];
  stringstream_proxy *local_18;
  stringstream_proxy *other_local;
  stringstream_proxy *this_local;
  
  local_18 = other;
  other_local = this;
  std::__cxx11::istringstream::str();
  std::__cxx11::istringstream::istringstream((istringstream *)this,local_38,_S_in);
  std::__cxx11::string::~string(local_38);
  uVar1 = *(undefined8 *)(*(long *)this + -0x18);
  std::ios::rdstate();
  std::ios::setstate((int)this + (int)uVar1);
  return;
}

Assistant:

stringstream_proxy(const stringstream_proxy& other) :
         stream_(other.stream_.str())
      {
         stream_.setstate(other.stream_.rdstate());
      }